

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::OptimizeInstructions,_void>::visit
          (Visitor<wasm::OptimizeInstructions,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::OptimizeInstructions,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      visitBlock(this,(Block *)curr);
      break;
    case IfId:
      OptimizeInstructions::visitIf((OptimizeInstructions *)(this + -0x58),(If *)curr);
      break;
    case LoopId:
      visitLoop(this,(Loop *)curr);
      break;
    case BreakId:
      OptimizeInstructions::visitBreak((OptimizeInstructions *)(this + -0x58),(Break *)curr);
      break;
    case SwitchId:
      visitSwitch(this,(Switch *)curr);
      break;
    case CallId:
      visitCall(this,(Call *)curr);
      break;
    case CallIndirectId:
      visitCallIndirect(this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      visitLocalGet(this,(LocalGet *)curr);
      break;
    case LocalSetId:
      OptimizeInstructions::visitLocalSet((OptimizeInstructions *)(this + -0x58),(LocalSet *)curr);
      break;
    case GlobalGetId:
      visitGlobalGet(this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      OptimizeInstructions::visitGlobalSet((OptimizeInstructions *)(this + -0x58),(GlobalSet *)curr)
      ;
      break;
    case LoadId:
      OptimizeInstructions::visitLoad((OptimizeInstructions *)(this + -0x58),(Load *)curr);
      break;
    case StoreId:
      OptimizeInstructions::visitStore((OptimizeInstructions *)(this + -0x58),(Store *)curr);
      break;
    case ConstId:
      visitConst(this,(Const *)curr);
      break;
    case UnaryId:
      OptimizeInstructions::visitUnary((OptimizeInstructions *)(this + -0x58),(Unary *)curr);
      break;
    case BinaryId:
      OptimizeInstructions::visitBinary((OptimizeInstructions *)(this + -0x58),(Binary *)curr);
      break;
    case SelectId:
      OptimizeInstructions::visitSelect((OptimizeInstructions *)(this + -0x58),(Select *)curr);
      break;
    case DropId:
      visitDrop(this,(Drop *)curr);
      break;
    case ReturnId:
      visitReturn(this,(Return *)curr);
      break;
    case MemorySizeId:
      visitMemorySize(this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      visitMemoryGrow(this,(MemoryGrow *)curr);
      break;
    case NopId:
      visitNop(this,(Nop *)curr);
      break;
    case UnreachableId:
      visitUnreachable(this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      visitAtomicRMW(this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      visitAtomicCmpxchg(this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      visitAtomicWait(this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      visitAtomicNotify(this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      visitAtomicFence(this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      visitSIMDExtract(this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      visitSIMDReplace(this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      visitSIMDShuffle(this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      visitSIMDTernary(this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      visitSIMDShift(this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      visitSIMDLoad(this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      visitSIMDLoadStoreLane(this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      visitMemoryInit(this,(MemoryInit *)curr);
      break;
    case DataDropId:
      visitDataDrop(this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      OptimizeInstructions::visitMemoryCopy
                ((OptimizeInstructions *)(this + -0x58),(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      OptimizeInstructions::visitMemoryFill
                ((OptimizeInstructions *)(this + -0x58),(MemoryFill *)curr);
      break;
    case PopId:
      visitPop(this,(Pop *)curr);
      break;
    case RefNullId:
      visitRefNull(this,(RefNull *)curr);
      break;
    case RefIsNullId:
      OptimizeInstructions::visitRefIsNull((OptimizeInstructions *)(this + -0x58),(RefIsNull *)curr)
      ;
      break;
    case RefFuncId:
      visitRefFunc(this,(RefFunc *)curr);
      break;
    case RefEqId:
      OptimizeInstructions::visitRefEq((OptimizeInstructions *)(this + -0x58),(RefEq *)curr);
      break;
    case TableGetId:
      visitTableGet(this,(TableGet *)curr);
      break;
    case TableSetId:
      visitTableSet(this,(TableSet *)curr);
      break;
    case TableSizeId:
      visitTableSize(this,(TableSize *)curr);
      break;
    case TableGrowId:
      visitTableGrow(this,(TableGrow *)curr);
      break;
    case TableFillId:
      visitTableFill(this,(TableFill *)curr);
      break;
    case TableCopyId:
      visitTableCopy(this,(TableCopy *)curr);
      break;
    case TableInitId:
      visitTableInit(this,(TableInit *)curr);
      break;
    case TryId:
      visitTry(this,(Try *)curr);
      break;
    case TryTableId:
      visitTryTable(this,(TryTable *)curr);
      break;
    case ThrowId:
      visitThrow(this,(Throw *)curr);
      break;
    case RethrowId:
      visitRethrow(this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      visitThrowRef(this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      visitTupleMake(this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      OptimizeInstructions::visitTupleExtract
                ((OptimizeInstructions *)(this + -0x58),(TupleExtract *)curr);
      break;
    case RefI31Id:
      visitRefI31(this,(RefI31 *)curr);
      break;
    case I31GetId:
      visitI31Get(this,(I31Get *)curr);
      break;
    case CallRefId:
      OptimizeInstructions::visitCallRef((OptimizeInstructions *)(this + -0x58),(CallRef *)curr);
      break;
    case RefTestId:
      OptimizeInstructions::visitRefTest((OptimizeInstructions *)(this + -0x58),(RefTest *)curr);
      break;
    case RefCastId:
      OptimizeInstructions::visitRefCast((OptimizeInstructions *)(this + -0x58),(RefCast *)curr);
      break;
    case BrOnId:
      visitBrOn(this,(BrOn *)curr);
      break;
    case StructNewId:
      OptimizeInstructions::visitStructNew((OptimizeInstructions *)(this + -0x58),(StructNew *)curr)
      ;
      break;
    case StructGetId:
      OptimizeInstructions::visitStructGet((OptimizeInstructions *)(this + -0x58),(StructGet *)curr)
      ;
      break;
    case StructSetId:
      OptimizeInstructions::visitStructSet((OptimizeInstructions *)(this + -0x58),(StructSet *)curr)
      ;
      break;
    case StructRMWId:
      OptimizeInstructions::visitStructRMW((OptimizeInstructions *)(this + -0x58),(StructRMW *)curr)
      ;
      break;
    case StructCmpxchgId:
      OptimizeInstructions::visitStructCmpxchg
                ((OptimizeInstructions *)(this + -0x58),(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      OptimizeInstructions::visitArrayNew((OptimizeInstructions *)(this + -0x58),(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      visitArrayNewData(this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      visitArrayNewElem(this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      OptimizeInstructions::visitArrayNewFixed
                ((OptimizeInstructions *)(this + -0x58),(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      OptimizeInstructions::visitArrayGet((OptimizeInstructions *)(this + -0x58),(ArrayGet *)curr);
      break;
    case ArraySetId:
      OptimizeInstructions::visitArraySet((OptimizeInstructions *)(this + -0x58),(ArraySet *)curr);
      break;
    case ArrayLenId:
      OptimizeInstructions::visitArrayLen((OptimizeInstructions *)(this + -0x58),(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      OptimizeInstructions::visitArrayCopy((OptimizeInstructions *)(this + -0x58),(ArrayCopy *)curr)
      ;
      break;
    case ArrayFillId:
      visitArrayFill(this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      visitArrayInitData(this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      visitArrayInitElem(this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      OptimizeInstructions::visitRefAs((OptimizeInstructions *)(this + -0x58),(RefAs *)curr);
      break;
    case StringNewId:
      visitStringNew(this,(StringNew *)curr);
      break;
    case StringConstId:
      visitStringConst(this,(StringConst *)curr);
      break;
    case StringMeasureId:
      visitStringMeasure(this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      visitStringEncode(this,(StringEncode *)curr);
      break;
    case StringConcatId:
      visitStringConcat(this,(StringConcat *)curr);
      break;
    case StringEqId:
      visitStringEq(this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      visitStringWTF16Get(this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      visitStringSliceWTF(this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      visitContNew(this,(ContNew *)curr);
      break;
    case ContBindId:
      visitContBind(this,(ContBind *)curr);
      break;
    case SuspendId:
      visitSuspend(this,(Suspend *)curr);
      break;
    case ResumeId:
      visitResume(this,(Resume *)curr);
      break;
    case ResumeThrowId:
      visitResumeThrow(this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      visitStackSwitch(this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::OptimizeInstructions>::visit(Expression *) [SubType = wasm::OptimizeInstructions, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }